

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

bool __thiscall
TTD::ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  int iVar1;
  uint64 ltime;
  FunctionBody *this_00;
  uint64 ftime;
  uint uVar2;
  SingleCallCounter *pSVar3;
  uint64 *puVar4;
  undefined8 unaff_R14;
  ULONG local_50;
  LONG local_4c;
  ULONG srcLine;
  LONG srcColumn;
  ExecutionInfoManager *local_40;
  undefined4 local_34;
  
  _srcLine = sourceLocation;
  pSVar3 = GetTopCallCounter(this);
  uVar2 = pSVar3->LastStatementIndex;
  local_40 = this;
  if (uVar2 == 0xffffffff) {
    iVar1 = (this->m_callStack).
            super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>.count
    ;
    if (1 < iVar1) {
      pSVar3 = JsUtil::ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
               ::Item(&(this->m_callStack).
                       super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
                      ,iVar1 + -2);
    }
    puVar4 = &pSVar3->CurrentStatementLoopTime;
    uVar2 = pSVar3->CurrentStatementIndex;
    local_34 = (undefined4)CONCAT71((int7)((ulong)unaff_R14 >> 8),iVar1 < 2);
  }
  else {
    puVar4 = &pSVar3->LastStatementLoopTime;
    local_34 = 0;
  }
  ltime = *puVar4;
  this_00 = pSVar3->Function;
  ftime = pSVar3->FunctionTime;
  local_50 = 0;
  local_4c = -1;
  uVar2 = Js::FunctionBody::GetStatementStartOffset(this_00,uVar2);
  Js::FunctionBody::GetSourceLineFromStartOffset_TTD(this_00,uVar2,&local_50,&local_4c);
  TTDebuggerSourceLocation::SetLocationFull
            (_srcLine,local_40->m_topLevelCallbackEventTime,ftime,ltime,this_00,local_50,local_4c);
  return SUB41(local_34,0);
}

Assistant:

bool ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        bool noPrevious = false;
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        //if we are at the first statement in the function then we want the parents current
        Js::FunctionBody* fbody = nullptr;
        int32 statementIndex = -1;
        uint64 ftime = 0;
        uint64 ltime = 0;
        if(cfinfo.LastStatementIndex == -1)
        {
            SingleCallCounter cfinfoCaller = { 0 };
            bool hasCaller = this->TryGetTopCallCallerCounter(cfinfoCaller);
            if (hasCaller)
            {
                ftime = cfinfoCaller.FunctionTime;
                ltime = cfinfoCaller.CurrentStatementLoopTime;

                fbody = cfinfoCaller.Function;
                statementIndex = cfinfoCaller.CurrentStatementIndex;
            }
            else
            {
                //Set the position info to the current statement and return true
                noPrevious = true;

                ftime = cfinfo.FunctionTime;
                ltime = cfinfo.CurrentStatementLoopTime;

                fbody = cfinfo.Function;
                statementIndex = cfinfo.CurrentStatementIndex;
            }
        }
        else
        {
            ftime = cfinfo.FunctionTime;
            ltime = cfinfo.LastStatementLoopTime;

            fbody = cfinfo.Function;
            statementIndex = cfinfo.LastStatementIndex;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = fbody->GetStatementStartOffset(statementIndex);
        fbody->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

        sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, ftime, ltime, fbody, srcLine, srcColumn);

        return noPrevious;
    }